

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

void MIR_link(MIR_context_t ctx,_func_void_MIR_context_t_MIR_item_t *set_interface,
             _func_void_ptr_char_ptr *import_resolver)

{
  void *pvVar1;
  undefined2 uVar2;
  int iVar3;
  size_t sVar4;
  MIR_error_func_t p_Var5;
  ulong local_88;
  size_t i_1;
  size_t i;
  anon_union_16_8_da7ae194 v;
  void *addr;
  MIR_module_t_conflict m;
  MIR_val_t res;
  MIR_type_t local_3c;
  MIR_item_t_conflict pMStack_38;
  MIR_type_t type;
  MIR_item_t_conflict expr_item;
  MIR_item_t_conflict tab_item;
  MIR_item_t_conflict item;
  _func_void_ptr_char_ptr *import_resolver_local;
  _func_void_MIR_context_t_MIR_item_t *set_interface_local;
  MIR_context_t ctx_local;
  
  item = (MIR_item_t_conflict)import_resolver;
  import_resolver_local = (_func_void_ptr_char_ptr *)set_interface;
  set_interface_local = (_func_void_MIR_context_t_MIR_item_t *)ctx;
  for (i_1 = 0; sVar4 = VARR_MIR_module_tlength(*(VARR_MIR_module_t **)(set_interface_local + 0xb0))
      , i_1 < sVar4; i_1 = i_1 + 1) {
    addr = VARR_MIR_module_tget(*(VARR_MIR_module_t **)(set_interface_local + 0xb0),i_1);
    simplify_module_init((MIR_context_t)set_interface_local);
    for (tab_item = DLIST_MIR_item_t_head((DLIST_MIR_item_t *)((long)addr + 0x10));
        tab_item != (MIR_item_t_conflict)0x0; tab_item = DLIST_MIR_item_t_next(tab_item)) {
      if (tab_item->item_type == MIR_func_item) {
        if (tab_item->data != (void *)0x0) {
          __assert_fail("item->data == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x7b1,
                        "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                       );
        }
        iVar3 = simplify_func((MIR_context_t)set_interface_local,tab_item,1);
        if (iVar3 != 0) {
          tab_item->data = (void *)0x1;
        }
      }
      else if (tab_item->item_type == MIR_import_item) {
        expr_item = item_tab_find((MIR_context_t)set_interface_local,(tab_item->u).import_id,
                                  (MIR_module_t_conflict)(set_interface_local + 0x50));
        if (expr_item == (MIR_item_t_conflict)0x0) {
          if ((item == (MIR_item_t_conflict)0x0) ||
             (v._8_8_ = (*(code *)item)((tab_item->u).func), v._8_8_ == 0)) {
            p_Var5 = MIR_get_error_func((MIR_context_t)set_interface_local);
            (*p_Var5)(MIR_undeclared_op_ref_error,"import of undefined item %s",(tab_item->u).func);
          }
          MIR_load_external((MIR_context_t)set_interface_local,(tab_item->u).import_id,
                            (void *)v._8_8_);
          expr_item = item_tab_find((MIR_context_t)set_interface_local,(tab_item->u).import_id,
                                    (MIR_module_t_conflict)(set_interface_local + 0x50));
          if (expr_item == (MIR_item_t_conflict)0x0) {
            __assert_fail("tab_item != ((void*)0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x7ba,
                          "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                         );
          }
        }
        tab_item->addr = expr_item->addr;
        tab_item->ref_def = expr_item;
      }
      else if (tab_item->item_type == MIR_export_item) {
        expr_item = item_tab_find((MIR_context_t)set_interface_local,(tab_item->u).import_id,
                                  (MIR_module_t_conflict)addr);
        if (expr_item == (MIR_item_t_conflict)0x0) {
          p_Var5 = MIR_get_error_func((MIR_context_t)set_interface_local);
          (*p_Var5)(MIR_undeclared_op_ref_error,"export of undefined item %s",(tab_item->u).func);
        }
        tab_item->addr = expr_item->addr;
        tab_item->ref_def = expr_item;
      }
      else if (tab_item->item_type == MIR_forward_item) {
        expr_item = item_tab_find((MIR_context_t)set_interface_local,(tab_item->u).import_id,
                                  (MIR_module_t_conflict)addr);
        if (expr_item == (MIR_item_t_conflict)0x0) {
          p_Var5 = MIR_get_error_func((MIR_context_t)set_interface_local);
          (*p_Var5)(MIR_undeclared_op_ref_error,"forward of undefined item %s",(tab_item->u).func);
        }
        tab_item->addr = expr_item->addr;
        tab_item->ref_def = expr_item;
      }
    }
  }
  local_88 = 0;
  do {
    sVar4 = VARR_MIR_module_tlength(*(VARR_MIR_module_t **)(set_interface_local + 0xb0));
    if (sVar4 <= local_88) {
      if (import_resolver_local != (_func_void_ptr_char_ptr *)0x0) {
        while (sVar4 = VARR_MIR_module_tlength(*(VARR_MIR_module_t **)(set_interface_local + 0xb0)),
              sVar4 != 0) {
          addr = VARR_MIR_module_tpop(*(VARR_MIR_module_t **)(set_interface_local + 0xb0));
          for (tab_item = DLIST_MIR_item_t_head(&((MIR_module_t_conflict)addr)->items);
              tab_item != (MIR_item_t_conflict)0x0; tab_item = DLIST_MIR_item_t_next(tab_item)) {
            if (tab_item->item_type == MIR_func_item) {
              finish_func_interpretation(tab_item);
              (*import_resolver_local)((char *)set_interface_local);
            }
          }
        }
        (*import_resolver_local)((char *)set_interface_local);
      }
      return;
    }
    addr = VARR_MIR_module_tget(*(VARR_MIR_module_t **)(set_interface_local + 0xb0),local_88);
    for (tab_item = DLIST_MIR_item_t_head(&((MIR_module_t_conflict)addr)->items);
        tab_item != (MIR_item_t_conflict)0x0; tab_item = DLIST_MIR_item_t_next(tab_item)) {
      if ((tab_item->item_type == MIR_func_item) && (tab_item->data != (void *)0x0)) {
        process_inlines((MIR_context_t)set_interface_local,tab_item);
        tab_item->data = (void *)0x0;
LAB_00116255:
        if (tab_item->item_type == MIR_expr_data_item) {
          pMStack_38 = ((tab_item->u).func)->func_item;
          MIR_interp((MIR_context_t)set_interface_local,pMStack_38,(MIR_val_t *)&m,0);
          local_3c = *((pMStack_38->u).func)->res_types;
          uVar2 = v.i16;
          switch(local_3c) {
          case MIR_T_I8:
          case MIR_T_U8:
            _i = CONCAT91(stack0xffffffffffffff89,(char)m._0_4_);
            break;
          case MIR_T_I16:
          case MIR_T_U16:
            _i = CONCAT82(stack0xffffffffffffff8a,(short)m._0_4_);
            break;
          case MIR_T_I32:
          case MIR_T_U32:
            _i = CONCAT64(stack0xffffffffffffff8c,m._0_4_);
            break;
          case MIR_T_I64:
          case MIR_T_U64:
            _i = CONCAT28(uVar2,CONCAT44(m._4_4_,m._0_4_));
            break;
          case MIR_T_F:
            _i = CONCAT64(stack0xffffffffffffff8c,m._0_4_);
            break;
          case MIR_T_D:
            _i = CONCAT28(uVar2,CONCAT44(m._4_4_,m._0_4_));
            break;
          case MIR_T_LD:
            _i = CONCAT28(res.ic._0_2_,CONCAT44(m._4_4_,m._0_4_));
            break;
          case MIR_T_P:
            _i = CONCAT28(uVar2,CONCAT44(m._4_4_,m._0_4_));
            break;
          default:
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                          ,0x7ef,
                          "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                         );
          }
          pvVar1 = ((tab_item->u).expr_data)->load_addr;
          sVar4 = _MIR_type_size((MIR_context_t)set_interface_local,
                                 *((pMStack_38->u).func)->res_types);
          memcpy(pvVar1,&i,sVar4);
        }
      }
      else {
        if (tab_item->item_type != MIR_ref_data_item) goto LAB_00116255;
        if (((tab_item->u).func)->func_item->addr == (void *)0x0) {
          __assert_fail("item->u.ref_data->ref_item->addr != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                        ,0x7d8,
                        "void MIR_link(MIR_context_t, void (*)(MIR_context_t, MIR_item_t), void *(*)(const char *))"
                       );
        }
        v._8_8_ = ((tab_item->u).func)->func_item->addr + (long)((tab_item->u).proto)->res_types;
        pvVar1 = ((tab_item->u).ref_data)->load_addr;
        sVar4 = _MIR_type_size((MIR_context_t)set_interface_local,MIR_T_P);
        memcpy(pvVar1,v.field8 + 8,sVar4);
      }
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

void MIR_link (MIR_context_t ctx, void (*set_interface) (MIR_context_t ctx, MIR_item_t item),
               void *import_resolver (const char *)) {
  MIR_item_t item, tab_item, expr_item;
  MIR_type_t type;
  MIR_val_t res;
  MIR_module_t m;
  void *addr;
  union {
    int8_t i8;
    int16_t i16;
    int32_t i32;
    int64_t i64;
    float f;
    double d;
    long double ld;
    void *a;
  } v;

  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    simplify_module_init (ctx);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item))
      if (item->item_type == MIR_func_item) {
        assert (item->data == NULL);
        if (simplify_func (ctx, item, TRUE)) item->data = (void *) 1; /* flag inlining */
      } else if (item->item_type == MIR_import_item) {
        if ((tab_item = item_tab_find (ctx, item->u.import_id, &environment_module)) == NULL) {
          if (import_resolver == NULL || (addr = import_resolver (item->u.import_id)) == NULL)
            MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "import of undefined item %s",
                                      item->u.import_id);
          MIR_load_external (ctx, item->u.import_id, addr);
          tab_item = item_tab_find (ctx, item->u.import_id, &environment_module);
          mir_assert (tab_item != NULL);
        }
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_export_item) {
        if ((tab_item = item_tab_find (ctx, item->u.export_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "export of undefined item %s",
                                    item->u.export_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      } else if (item->item_type == MIR_forward_item) {
        if ((tab_item = item_tab_find (ctx, item->u.forward_id, m)) == NULL)
          MIR_get_error_func (ctx) (MIR_undeclared_op_ref_error, "forward of undefined item %s",
                                    item->u.forward_id);
        item->addr = tab_item->addr;
        item->ref_def = tab_item;
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (MIR_module_t, modules_to_link); i++) {
    m = VARR_GET (MIR_module_t, modules_to_link, i);
    for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
         item = DLIST_NEXT (MIR_item_t, item)) {
      if (item->item_type == MIR_func_item && item->data != NULL) {
        process_inlines (ctx, item);
        item->data = NULL;
#if 0
        fprintf (stderr, "+++++ Function after inlining:\n");
        MIR_output_item (ctx, stderr, item);
#endif
      } else if (item->item_type == MIR_ref_data_item) {
        assert (item->u.ref_data->ref_item->addr != NULL);
        addr = (char *) item->u.ref_data->ref_item->addr + item->u.ref_data->disp;
        memcpy (item->u.ref_data->load_addr, &addr, _MIR_type_size (ctx, MIR_T_P));
        continue;
      }
      /* lref data are set up in interpreter or generator */
      if (item->item_type != MIR_expr_data_item) continue;
      expr_item = item->u.expr_data->expr_item;
      MIR_interp (ctx, expr_item, &res, 0);
      type = expr_item->u.func->res_types[0];
      switch (type) {
      case MIR_T_I8:
      case MIR_T_U8: v.i8 = (int8_t) res.i; break;
      case MIR_T_I16:
      case MIR_T_U16: v.i16 = (int16_t) res.i; break;
      case MIR_T_I32:
      case MIR_T_U32: v.i32 = (int32_t) res.i; break;
      case MIR_T_I64:
      case MIR_T_U64: v.i64 = (int64_t) res.i; break;
      case MIR_T_F: v.f = res.f; break;
      case MIR_T_D: v.d = res.d; break;
      case MIR_T_LD: v.ld = res.ld; break;
      case MIR_T_P: v.a = res.a; break;
      default: assert (FALSE); break;
      }
      memcpy (item->u.expr_data->load_addr, &v,
              _MIR_type_size (ctx, expr_item->u.func->res_types[0]));
    }
  }
  if (set_interface != NULL) {
    while (VARR_LENGTH (MIR_module_t, modules_to_link) != 0) {
      m = VARR_POP (MIR_module_t, modules_to_link);
      for (item = DLIST_HEAD (MIR_item_t, m->items); item != NULL;
           item = DLIST_NEXT (MIR_item_t, item))
        if (item->item_type == MIR_func_item) {
          finish_func_interpretation (item); /* in case if it was used for expr data */
          set_interface (ctx, item);
        }
    }
    set_interface (ctx, NULL); /* finish interface setting */
  }
}